

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O2

TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> * __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::operator=
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,
          TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *cp)

{
  TPZGeoBlend<pzgeom::TPZGeoQuad>::operator=
            (&this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>,&cp->super_TPZGeoBlend<pzgeom::TPZGeoQuad>
            );
  this->fR = cp->fR;
  TPZVec<double>::operator=(&this->fxc,&cp->fxc);
  return this;
}

Assistant:

TPZQuadSphere &operator=(const TPZQuadSphere &cp)
        {
            GeomQuad::operator=(cp);
            fR = cp.fR;
            fxc = cp.fxc;
            return *this;
        }